

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O0

void __thiscall wasm::SafeHeap::addLoadFunc(SafeHeap *this,Load style,Module *module)

{
  initializer_list<wasm::Type> __l;
  Signature sig;
  initializer_list<wasm::Type> types;
  Block *pBVar1;
  bool bVar2;
  BinaryOp op;
  uint bytes;
  Function *pFVar3;
  Memory *this_00;
  ExpressionList *pEVar4;
  LocalGet *pLVar5;
  LocalGet *right;
  Binary *value;
  LocalSet *item;
  Expression *pEVar6;
  address64_t aVar7;
  pointer pFVar8;
  optional<wasm::Type> type_;
  Name NVar9;
  undefined1 local_1b0 [12];
  Load *local_1a0;
  Expression *last;
  Load *local_190;
  Load *load;
  char *pcStack_180;
  address64_t local_170;
  size_t local_168;
  char *pcStack_160;
  Type local_150;
  Type local_148;
  uintptr_t local_140;
  uintptr_t local_138;
  Block *local_130;
  Block *block;
  Builder builder;
  allocator<wasm::Type> local_109;
  Type local_108;
  iterator local_100;
  size_type local_f8;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_f0;
  uintptr_t local_d8;
  uintptr_t uStack_d0;
  HeapType local_c0;
  char *local_b8;
  HeapType HStack_b0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_a8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Type local_98;
  uintptr_t local_90;
  iterator local_88;
  undefined8 local_80;
  Type local_78;
  undefined1 auStack_70 [8];
  Signature funcSig;
  Type addressType;
  Memory *memory;
  char *pcStack_28;
  Name name;
  Module *module_local;
  SafeHeap *this_local;
  
  NVar9 = getLoadName(&style);
  pcStack_28 = NVar9.super_IString.str._M_len;
  name.super_IString.str._M_len = NVar9.super_IString.str._M_str;
  pFVar3 = Module::getFunctionOrNull(module,NVar9);
  if (pFVar3 == (Function *)0x0) {
    this_00 = Module::getMemory(module,style.memory);
    local_98.id = (this_00->addressType).id;
    local_88 = &local_98;
    local_80 = 2;
    types._M_len = 2;
    types._M_array = local_88;
    local_90 = local_98.id;
    funcSig.results.id = local_98.id;
    wasm::Type::Type(&local_78,types);
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    Signature::Signature
              ((Signature *)auStack_70,local_78,
               style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type);
    local_b8 = pcStack_28;
    HStack_b0.id = name.super_IString.str._M_len;
    local_d8 = (uintptr_t)auStack_70;
    uStack_d0 = funcSig.params.id;
    sig.results.id = funcSig.params.id;
    sig.params.id = (uintptr_t)auStack_70;
    HeapType::HeapType(&local_c0,sig);
    local_108.id = funcSig.results.id;
    local_100 = &local_108;
    local_f8 = 1;
    std::allocator<wasm::Type>::allocator(&local_109);
    __l._M_len = local_f8;
    __l._M_array = local_100;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_f0,__l,&local_109);
    NVar9.super_IString.str._M_str = local_b8;
    NVar9.super_IString.str._M_len = (size_t)&local_a8;
    Builder::makeFunction
              (NVar9,HStack_b0,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_c0.id,
               (Expression *)&local_f0);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_f0);
    std::allocator<wasm::Type>::~allocator(&local_109);
    Builder::Builder((Builder *)&block,module);
    local_130 = Builder::makeBlock((Builder *)&block,(Expression *)0x0);
    pEVar4 = &local_130->list;
    bVar2 = Memory::is64(this_00);
    op = AddInt32;
    if (bVar2) {
      op = AddInt64;
    }
    local_138 = funcSig.results.id;
    pLVar5 = Builder::makeLocalGet((Builder *)&block,0,funcSig.results);
    local_140 = funcSig.results.id;
    right = Builder::makeLocalGet((Builder *)&block,1,funcSig.results);
    value = Builder::makeBinary((Builder *)&block,op,(Expression *)pLVar5,(Expression *)right);
    item = Builder::makeLocalSet((Builder *)&block,2,(Expression *)value);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar4->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    pEVar4 = &local_130->list;
    local_148 = (Type)style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type
                      .id;
    bytes = (uint)style.bytes;
    local_150.id = (this_00->addressType).id;
    bVar2 = Memory::is64(this_00);
    local_168 = (this_00->super_Importable).super_Named.name.super_IString.str._M_len;
    pcStack_160 = (this_00->super_Importable).super_Named.name.super_IString.str._M_str;
    pEVar6 = makeBoundsCheck(this,local_148,(Builder *)&block,0,2,bytes,module,local_150,bVar2,
                             (Name)(this_00->super_Importable).super_Named.name.super_IString.str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar4->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar6);
    aVar7 = wasm::Address::operator_cast_to_unsigned_long(&style.align);
    if (1 < aVar7) {
      pEVar4 = &local_130->list;
      local_170 = style.align.addr;
      load = (Load *)(this_00->super_Importable).super_Named.name.super_IString.str._M_len;
      pcStack_180 = (this_00->super_Importable).super_Named.name.super_IString.str._M_str;
      pEVar6 = makeAlignCheck(this,style.align,(Builder *)&block,2,module,
                              (Name)(this_00->super_Importable).super_Named.name.super_IString.str);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar4->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,pEVar6);
    }
    local_190 = MixedArena::alloc<wasm::Load>(&module->allocator);
    Load::operator=(local_190,&style);
    last = (Expression *)funcSig.results.id;
    pLVar5 = Builder::makeLocalGet((Builder *)&block,2,funcSig.results);
    local_190->ptr = (Expression *)pLVar5;
    local_1a0 = local_190;
    if (((local_190->isAtomic & 1U) != 0) && ((local_190->signed_ & 1U) != 0)) {
      local_1a0 = (Load *)Bits::makeSignExt((Expression *)local_190,(uint)local_190->bytes,module);
      local_190->signed_ = false;
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(local_130->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)local_1a0);
    pBVar1 = local_130;
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
              ((optional<wasm::Type> *)local_1b0,
               &style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type);
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_1b0._0_8_;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_1b0[8];
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_1b0._9_3_;
    Block::finalize(pBVar1,type_,Unknown);
    pBVar1 = local_130;
    pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_a8);
    pFVar8->body = (Expression *)pBVar1;
    Module::addFunction(module,&local_a8);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_a8);
  }
  return;
}

Assistant:

void addLoadFunc(Load style, Module* module) {
    auto name = getLoadName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    // pointer, offset
    auto memory = module->getMemory(style.memory);
    auto addressType = memory->addressType;
    auto funcSig = Signature({addressType, addressType}, style.type);
    auto func = Builder::makeFunction(name, funcSig, {addressType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    // stash the sum of the pointer (0) and the size (1) in a local (2)
    block->list.push_back(builder.makeLocalSet(
      2,
      builder.makeBinary(memory->is64() ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, addressType),
                         builder.makeLocalGet(1, addressType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.type,
                                          builder,
                                          0,
                                          2,
                                          style.bytes,
                                          module,
                                          memory->addressType,
                                          memory->is64(),
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 2, module, memory->name));
    }
    // do the load
    auto* load = module->allocator.alloc<Load>();
    *load = style; // basically the same as the template we are given!
    load->ptr = builder.makeLocalGet(2, addressType);
    Expression* last = load;
    if (load->isAtomic && load->signed_) {
      // atomic loads cannot be signed, manually sign it
      last = Bits::makeSignExt(load, load->bytes, *module);
      load->signed_ = false;
    }
    block->list.push_back(last);
    block->finalize(style.type);
    func->body = block;
    module->addFunction(std::move(func));
  }